

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O0

int dtls1_process_heartbeat(SSL *s)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar *puVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  uchar *buf;
  uint seq;
  int r;
  uchar *bp;
  uchar *buffer;
  uint padding;
  uint payload;
  unsigned_short hbtype;
  uchar *pl;
  uchar *p;
  SSL *s_local;
  
  puVar4 = (s->s3->rrec).data;
  uVar1 = *puVar4;
  uVar2 = puVar4[1];
  uVar3 = puVar4[2];
  uVar5 = CONCAT11(uVar2,uVar3);
  uVar6 = (uint)uVar5;
  if (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0) {
    (*s->msg_callback)(0,s->version,0x18,(s->s3->rrec).data,(long)(s->s3->rrec).length,s,
                       s->msg_callback_arg);
  }
  if (uVar1 == '\x01') {
    buf = OPENSSL_malloc(uVar6 + 0x13);
    *buf = '\x02';
    buf[1] = uVar2;
    buf[2] = uVar3;
    memcpy(buf + 3,puVar4 + 3,(ulong)uVar6);
    RAND_pseudo_bytes(buf + 3 + uVar6,0x10);
    iVar7 = dtls1_write_bytes(s,0x18,buf,uVar6 + 0x13);
    if ((-1 < iVar7) &&
       (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0)) {
      (*s->msg_callback)(1,s->version,0x18,buf,(ulong)uVar5 + 0x13,s,s->msg_callback_arg);
    }
    OPENSSL_free(buf);
    if (iVar7 < 0) {
      return iVar7;
    }
  }
  else if (((uVar1 == '\x02') && (uVar6 == 0x12)) &&
          ((uint)CONCAT11(puVar4[3],puVar4[4]) == s->tlsext_hb_seq)) {
    dtls1_stop_timer(s);
    s->tlsext_hb_seq = s->tlsext_hb_seq + 1;
    s->tlsext_hb_pending = 0;
  }
  return 0;
}

Assistant:

int
dtls1_process_heartbeat(SSL *s) {
  unsigned char *p = &s->s3->rrec.data[0], *pl;
  unsigned short hbtype;
  unsigned int payload;
  unsigned int padding = 16; /* Use minimum padding */

  /* Read type and payload length first */
  hbtype = *p++;
  n2s(p, payload);
  pl = p;

  if (s->msg_callback)
    s->msg_callback(0, s->version, TLS1_RT_HEARTBEAT,
                    &s->s3->rrec.data[0], s->s3->rrec.length,
                    s, s->msg_callback_arg);

  if (hbtype == TLS1_HB_REQUEST) {
    unsigned char *buffer, *bp;
    int r;

    /* Allocate memory for the response, size is 1 byte
     * message type, plus 2 bytes payload length, plus
     * payload, plus padding
     */
    buffer = OPENSSL_malloc(1 + 2 + payload + padding);
    bp = buffer;

    /* Enter response type, length and copy payload */
    *bp++ = TLS1_HB_RESPONSE;
    s2n(payload, bp);
    memcpy(bp, pl, payload);
    bp += payload;
    /* Random padding */
    RAND_pseudo_bytes(bp, padding);

    r = dtls1_write_bytes(s, TLS1_RT_HEARTBEAT, buffer, 3 + payload + padding);

    if (r >= 0 && s->msg_callback)
      s->msg_callback(1, s->version, TLS1_RT_HEARTBEAT,
                      buffer, 3 + payload + padding,
                      s, s->msg_callback_arg);

    OPENSSL_free(buffer);

    if (r < 0)
      return r;
  } else if (hbtype == TLS1_HB_RESPONSE) {
    unsigned int seq;

    /* We only send sequence numbers (2 bytes unsigned int),
     * and 16 random bytes, so we just try to read the
     * sequence number */
    n2s(pl, seq);

    if (payload == 18 && seq == s->tlsext_hb_seq) {
      dtls1_stop_timer(s);
      s->tlsext_hb_seq++;
      s->tlsext_hb_pending = 0;
    }
  }

  return 0;
}